

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O3

void __thiscall
args::
MapFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MappingEnum,_ToLowerReader,_args::detail::unordered_map>
::ParseValue(MapFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MappingEnum,_ToLowerReader,_args::detail::unordered_map>
             *this,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *values_)

{
  string *value;
  const_iterator cVar1;
  ostream *poVar2;
  runtime_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> key;
  ostringstream problem;
  string local_1d8;
  string local_1b8 [32];
  ostringstream local_198 [376];
  
  value = (values_->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  if ((values_->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish == value) {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
  }
  local_1d8._M_string_length = 0;
  local_1d8.field_2._M_local_buf[0] = '\0';
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  ToLowerReader::operator()
            ((ToLowerReader *)&this->field_0x150,
             &(this->super_ValueFlagBase).super_FlagBase.super_NamedBase.name,value,&local_1d8);
  cVar1 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MappingEnum>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MappingEnum>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->map)._M_h,&local_1d8);
  if (cVar1.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MappingEnum>,_true>
      ._M_cur != (__node_type *)0x0) {
    this->value = *(MappingEnum *)
                   ((long)cVar1.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MappingEnum>,_true>
                          ._M_cur + 0x28);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p);
    }
    return;
  }
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"Could not find key \'",0x14);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_198,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\' in map for arg \'",0x12);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(this->super_ValueFlagBase).super_FlagBase.super_NamedBase.name.
                             _M_dataplus._M_p,
                      (this->super_ValueFlagBase).super_FlagBase.super_NamedBase.name.
                      _M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\'",1);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this_00,local_1b8);
  *(undefined ***)this_00 = &PTR__runtime_error_0021bc78;
  __cxa_throw(this_00,&MapError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

virtual Error GetError() const
            {
                return error;
            }